

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::SurfaceSyncCollisionModels(ChContactSurfaceNodeCloud *this)

{
  pointer psVar1;
  pointer psVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    psVar1 = (this->vnodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->vnodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)uVar3) break;
    (**(code **)((long)(psVar1[uVar3].
                        super___shared_ptr<chrono::fea::ChContactNodeXYZsphere,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->collision_model->_vptr_ChCollisionModel + 0xc0))();
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    psVar2 = (this->vnodes_rot).
             super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->vnodes_rot).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <=
        (ulong)uVar3) break;
    (**(code **)((long)(psVar2[uVar3].
                        super___shared_ptr<chrono::fea::ChContactNodeXYZROTsphere,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->collision_model->_vptr_ChCollisionModel + 0xc0))();
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void ChContactSurfaceNodeCloud::SurfaceSyncCollisionModels() {
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        this->vnodes[j]->GetCollisionModel()->SyncPosition();
    }
    for (unsigned int j = 0; j < vnodes_rot.size(); j++) {
        this->vnodes_rot[j]->GetCollisionModel()->SyncPosition();
    }
}